

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

vector_t *** alloc_acc(gauden_t *g,uint32 n_id)

{
  uint uVar1;
  uint32 uVar2;
  uint uVar3;
  void *pvVar4;
  vector_t ***ppppfVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  iVar10 = 0;
  for (uVar6 = 0; g->n_feat != uVar6; uVar6 = uVar6 + 1) {
    iVar10 = iVar10 + g->veclen[uVar6] * g->n_density;
  }
  pvVar4 = __ckd_calloc__((ulong)(iVar10 * n_id),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x21c);
  ppppfVar5 = (vector_t ***)
              __ckd_calloc_3d__((ulong)n_id,(ulong)g->n_feat,(ulong)g->n_density,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x221);
  uVar7 = 0;
  for (uVar6 = 0; uVar6 != n_id; uVar6 = uVar6 + 1) {
    uVar1 = g->n_feat;
    for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
      uVar2 = g->veclen[uVar8];
      uVar3 = g->n_density;
      for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
        ppppfVar5[uVar6][uVar8][uVar9] = (vector_t)((long)pvVar4 + (ulong)uVar7 * 4);
        uVar7 = uVar7 + uVar2;
      }
    }
  }
  if (uVar7 == iVar10 * n_id) {
    return ppppfVar5;
  }
  __assert_fail("l == tl",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x230,"vector_t ***alloc_acc(gauden_t *, uint32)");
}

Assistant:

static vector_t ***
alloc_acc(gauden_t *g, uint32 n_id)
{
    uint32 i, j, k, l, vl, tl;
    float32 *b;
    vector_t ***out;

    for (i = 0, tl = 0; i < g->n_feat; i++) {
	tl += g->n_density * g->veclen[i];
    }

    tl *= n_id;

    b = ckd_calloc(tl, sizeof(float32));

    out = (vector_t ***) ckd_calloc_3d(n_id,
				      g->n_feat,
				      g->n_density,
				      sizeof(vector_t));

    for (i = 0, l = 0; i < n_id; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    vl = g->veclen[j];

	    for (k = 0; k < g->n_density; k++) {
		out[i][j][k] = &b[l];
		
		l += vl;
	    }
	}
    }

    assert(l == tl);

    return out;
}